

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *MetaSeek)

{
  fourcc_t Id;
  bool_t bVar1;
  ebml_context *peVar2;
  long lVar3;
  ebml_binary *Element;
  size_t DataSize;
  ebml_integer *Element_00;
  filepos_t fVar4;
  filepos_t fVar5;
  matroska_seekpoint *Element_01;
  ebml_element *Link;
  uint8_t IdBuffer [4];
  
  Link = (ebml_element *)0x0;
  bVar1 = Node_IsPartOf(MetaSeek,0x44564245);
  if (bVar1 == 0) {
    peVar2 = MATROSKA_getContextSeek();
    bVar1 = EBML_ElementIsType((ebml_element *)MetaSeek,peVar2);
    if (bVar1 == 0) {
      __assert_fail("EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x1c7,"err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *)");
    }
    Element_01 = MetaSeek;
    do {
      Element_01 = (matroska_seekpoint *)(Element_01->Base).Base.Base.Parent;
      if (Element_01 == (matroska_seekpoint *)0x0) {
        return -3;
      }
      peVar2 = MATROSKA_getContextSegment();
      bVar1 = EBML_ElementIsType((ebml_element *)Element_01,peVar2);
    } while (bVar1 == 0);
    if (MetaSeek == (matroska_seekpoint *)0x0) {
      __assert_fail("(const void*)(MetaSeek)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x1ce,"err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *)");
    }
    lVar3 = (**(code **)((long)(MetaSeek->Base).Base.Base.Base.VMT + 0x18))(MetaSeek,0x100,&Link);
    if ((lVar3 == 0) && (lVar3 = -3, Link != (ebml_element *)0x0)) {
      peVar2 = MATROSKA_getContextSeekID();
      lVar3 = 0;
      Element = (ebml_binary *)EBML_MasterFindFirstElt(&MetaSeek->Base,peVar2,1,0,0);
      Id = EBML_ElementClassID(Link);
      DataSize = EBML_FillBufferID(IdBuffer,4,Id);
      EBML_BinarySetData(Element,IdBuffer,DataSize);
      peVar2 = MATROSKA_getContextSeekPosition();
      Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(&MetaSeek->Base,peVar2,1,0,0);
      fVar4 = EBML_ElementPosition(Link);
      fVar5 = EBML_ElementPositionData((ebml_element *)Element_01);
      EBML_IntegerSetValue(Element_00,fVar4 - fVar5);
    }
  }
  else {
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

err_t MATROSKA_MetaSeekUpdate(matroska_seekpoint *MetaSeek)
{
    ebml_element *WSeekID, *WSeekPosSegmentInfo, *RSegment, *Link = NULL;
    size_t IdSize;
    err_t Err;
    uint8_t IdBuffer[4];

    if (Node_IsPartOf(MetaSeek,EBML_VOID_CLASS))
        return ERR_NONE;

    assert(EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek()));
    RSegment = EBML_ElementParent(MetaSeek);
    while (RSegment && !EBML_ElementIsType(RSegment, MATROSKA_getContextSegment()))
        RSegment = EBML_ElementParent(RSegment);
    if (!RSegment)
        return ERR_INVALID_DATA;

    Err = Node_GET(MetaSeek,MATROSKA_SEEKPOINT_ELEMENT,&Link);
    if (Err != ERR_NONE)
        return Err;
    if (Link==NULL)
        return ERR_INVALID_DATA;

    WSeekID = EBML_MasterFindFirstElt((ebml_master*)MetaSeek,MATROSKA_getContextSeekID(),1,0,0);
    IdSize = EBML_FillBufferID(IdBuffer,sizeof(IdBuffer),EBML_ElementClassID(Link));
    EBML_BinarySetData((ebml_binary*)WSeekID,IdBuffer,IdSize);

    WSeekPosSegmentInfo = EBML_MasterFindFirstElt((ebml_master*)MetaSeek,MATROSKA_getContextSeekPosition(),1,0,0);
    EBML_IntegerSetValue((ebml_integer*)WSeekPosSegmentInfo, EBML_ElementPosition(Link) - EBML_ElementPositionData(RSegment));

    return Err;
}